

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

void drwav_f64_to_s16(drwav_int16 *pOut,double *pIn,size_t sampleCount)

{
  double local_48;
  double local_40;
  double c;
  double x;
  size_t i;
  int r;
  size_t sampleCount_local;
  double *pIn_local;
  drwav_int16 *pOut_local;
  
  for (i = 0; i < sampleCount; i = i + 1) {
    local_48 = pIn[i];
    if (-1.0 <= local_48) {
      if (1.0 < local_48) {
        local_48 = 1.0;
      }
      local_40 = local_48;
    }
    else {
      local_40 = -1.0;
    }
    pOut[i] = (short)(int)((local_40 + 1.0) * 32767.5) + -0x8000;
  }
  return;
}

Assistant:

void drwav_f64_to_s16(drwav_int16* pOut, const double* pIn, size_t sampleCount)
{
    int r;
    for (size_t i = 0; i < sampleCount; ++i) {
        double x = pIn[i];
        double c;
        c = ((x < -1) ? -1 : ((x > 1) ? 1 : x));
        c = c + 1;
        r = (int)(c * 32767.5);
        r = r - 32768;
        pOut[i] = (short)r;
    }
}